

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimulationResult.cpp
# Opt level: O0

void __thiscall SimulationResult::UpdateStatistics(SimulationResult *this)

{
  undefined1 auVar1 [16];
  reference pvVar2;
  double *in_RDI;
  undefined1 in_ZMM1 [64];
  uint i;
  double sum;
  uint local_14;
  double local_10;
  
  local_10 = 0.0;
  for (local_14 = 0; local_14 < *(uint *)(in_RDI + 5); local_14 = local_14 + 1) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 1),(ulong)local_14);
    local_10 = *pvVar2 + local_10;
  }
  if (*(int *)(in_RDI + 5) == 0) {
    *in_RDI = 1.79769313486232e+308;
  }
  else {
    auVar1 = vcvtusi2sd_avx512f(in_ZMM1._0_16_,*(undefined4 *)(in_RDI + 5));
    *in_RDI = local_10 / auVar1._0_8_;
  }
  return;
}

Assistant:

void SimulationResult::UpdateStatistics()
{ 
    // update the average reward
    double sum=0;
    for(unsigned int i=0;i<_m_nr_stored;i++)
        sum+=_m_rewards[i];

    if(_m_nr_stored>0)
        _m_avg_reward=sum/_m_nr_stored;
    else
        _m_avg_reward=DBL_MAX;
}